

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O0

unsigned_short Imf_2_5::anon_unknown_0::forwardLutFromBitmap(uchar *bitmap,unsigned_short *lut)

{
  unsigned_short uVar1;
  int i;
  int k;
  unsigned_short *lut_local;
  uchar *bitmap_local;
  
  k = 0;
  for (i = 0; uVar1 = (unsigned_short)k, i < 0x10000; i = i + 1) {
    if ((i == 0) || (((uint)bitmap[i >> 3] & 1 << ((byte)i & 7)) != 0)) {
      k = k + 1;
      lut[i] = uVar1;
    }
    else {
      lut[i] = 0;
    }
  }
  return uVar1 - 1;
}

Assistant:

unsigned short
forwardLutFromBitmap (const unsigned char bitmap[BITMAP_SIZE],
		      unsigned short lut[USHORT_RANGE])
{
    int k = 0;

    for (int i = 0; i < USHORT_RANGE; ++i)
    {
	if ((i == 0) || (bitmap[i >> 3] & (1 << (i & 7))))
	    lut[i] = k++;
	else
	    lut[i] = 0;
    }

    return k - 1;	// maximum value stored in lut[],
}